

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

size_t utf32_to_utf8(char *out,size_t n_out,uint32_t *in,size_t n_in,size_t *pn_cnvt)

{
  long lVar1;
  uint32_t *in_lim;
  uint32_t *in_orig;
  size_t nwritten;
  size_t *pn_cnvt_local;
  size_t n_in_local;
  uint32_t *in_local;
  size_t n_out_local;
  char *out_local;
  
  in_orig = (uint32_t *)0x0;
  in_local = (uint32_t *)n_out;
  for (n_in_local = (size_t)in; (uint32_t *)n_in_local != in + n_in; n_in_local = n_in_local + 4) {
    if (*(uint *)n_in_local < 0x80) {
      if ((*(int *)n_in_local == 0) || (in_local < (uint32_t *)0x2)) break;
      out[(long)in_orig] = (char)*(undefined4 *)n_in_local;
      in_local = (uint32_t *)((long)in_local + -1);
      in_orig = (uint32_t *)((long)in_orig + 1);
    }
    else if (*(uint *)n_in_local < 0x800) {
      if (in_local < (uint32_t *)0x3) break;
      lVar1 = (long)in_orig + 1;
      out[(long)in_orig] = (char)((*(uint *)n_in_local & 0x7c0) >> 6) + -0x40;
      in_orig = (uint32_t *)((long)in_orig + 2);
      out[lVar1] = ((byte)*(undefined4 *)n_in_local & 0x3f) + 0x80;
      in_local = (uint32_t *)((long)in_local + -2);
    }
    else if (*(uint *)n_in_local < 0x10000) {
      if (((0xd7ff < *(uint *)n_in_local) && (*(uint *)n_in_local < 0xe000)) ||
         (in_local < (uint32_t *)0x4)) break;
      out[(long)in_orig] = (char)((*(uint *)n_in_local & 0xf000) >> 0xc) + -0x20;
      lVar1 = (long)in_orig + 2;
      out[(long)in_orig + 1] = (char)((*(uint *)n_in_local & 0xfc0) >> 6) + -0x80;
      in_orig = (uint32_t *)((long)in_orig + 3);
      out[lVar1] = ((byte)*(undefined4 *)n_in_local & 0x3f) + 0x80;
      in_local = (uint32_t *)((long)in_local + -3);
    }
    else {
      if ((0x10ffff < *(uint *)n_in_local) || (in_local < (uint32_t *)0x5)) break;
      out[(long)in_orig] = (char)((*(uint *)n_in_local & 0x1c0000) >> 0x12) + -0x10;
      out[(long)in_orig + 1] = (char)((*(uint *)n_in_local & 0x3f000) >> 0xc) + -0x80;
      lVar1 = (long)in_orig + 3;
      out[(long)in_orig + 2] = (char)((*(uint *)n_in_local & 0xfc0) >> 6) + -0x80;
      in_orig = in_orig + 1;
      out[lVar1] = ((byte)*(undefined4 *)n_in_local & 0x3f) + 0x80;
      in_local = in_local + -1;
    }
  }
  if (in_local != (uint32_t *)0x0) {
    out[(long)in_orig] = '\0';
  }
  if (pn_cnvt != (size_t *)0x0) {
    *pn_cnvt = (long)(n_in_local - (long)in) >> 2;
  }
  return (size_t)in_orig;
}

Assistant:

size_t utf32_to_utf8(char *out, size_t n_out, const uint32_t *in, size_t n_in,
	size_t *pn_cnvt)
{
	size_t nwritten = 0;
	const uint32_t *in_orig = in;
	const uint32_t *in_lim = in + n_in;

	while (1) {
		if (in == in_lim) {
			break;
		}
		if (*in <= 0x7f) {
			/* Encoded as single byte. */
			if (*in == 0) {
				break;
			}
			if (n_out <= 1) {
				break;
			}
			out[nwritten++] = (char) *in;
			--n_out;
		} else if (*in <= 0x7ff) {
			/* Encoded as two bytes. */
			if (n_out <= 2) {
				break;
			}
			out[nwritten++] = 0xc0 + ((*in & 0x7c0) >> 6);
			out[nwritten++] = 0x80 + (*in & 0x3f);
			n_out -= 2;
		} else if (*in <= 0xffff) {
			/* Encoded as three bytes. */
			if (*in >= 0xd800 && *in <= 0xdfff) {
				/*
				 * Those are reserved for UTF-16 surrogate
				 * pairs and should not be encoded.
				 */
				break;
			}
			if (n_out <= 3) {
				break;
			}
			out[nwritten++] = 0xe0 + ((*in & 0xf000) >> 12);
			out[nwritten++] = 0x80 + ((*in & 0xfc0) >> 6);
			out[nwritten++] = 0x80 + (*in & 0x3f);
			n_out -= 3;
		} else if (*in <= 0x10ffff) {
			/*
			 * Encoded as four bytes.  The upper limit of 0x10ffff
			 * is imposed by the limits of UTF-16.  Without that,
			 * the four byte encoding can handle values up to
			 * 0x1fffff.
			 */
			if (n_out <= 4) {
				break;
			}
			out[nwritten++] = 0xf0 + ((*in & 0x1c0000) >> 18);
			out[nwritten++] = 0x80 + ((*in & 0x3f000) >> 12);
			out[nwritten++] = 0x80 + ((*in & 0xfc0) >> 6);
			out[nwritten++] = 0x80 + (*in & 0x3f);
			n_out -= 4;
		} else {
			break;
		}
		++in;
	}
	if (n_out > 0) {
		out[nwritten] = 0;
	}
	if (pn_cnvt) {
		*pn_cnvt = in - in_orig;
	}
	return nwritten;
}